

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint32_t helper_efdctuf(CPUPPCState_conflict *env,uint64_t val)

{
  int iVar1;
  float64 fVar2;
  float64 tmp;
  CPU_DoubleU u;
  uint64_t val_local;
  CPUPPCState_conflict *env_local;
  
  iVar1 = float64_is_any_nan(val);
  if (iVar1 == 0) {
    fVar2 = uint64_to_float64_ppc(0x100000000,&env->vec_status);
    fVar2 = float64_mul_ppc(val,fVar2,&env->vec_status);
    env_local._4_4_ = float64_to_uint32_ppc(fVar2,&env->vec_status);
  }
  else {
    env_local._4_4_ = 0;
  }
  return env_local._4_4_;
}

Assistant:

uint32_t helper_efdctuf(CPUPPCState *env, uint64_t val)
{
    CPU_DoubleU u;
    float64 tmp;

    u.ll = val;
    /* NaN are not treated the same way IEEE 754 does */
    if (unlikely(float64_is_any_nan(u.d))) {
        return 0;
    }
    tmp = uint64_to_float64(1ULL << 32, &env->vec_status);
    u.d = float64_mul(u.d, tmp, &env->vec_status);

    return float64_to_uint32(u.d, &env->vec_status);
}